

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::FromSerialNumber(ON_ClippingPlaneDataList *this,uint sn)

{
  ON_ClippingPlaneData *pOVar1;
  long lVar2;
  long lVar3;
  
  if ((sn != 0) && (lVar2 = (long)(this->m_list).m_count, 0 < lVar2)) {
    lVar3 = 0;
    do {
      pOVar1 = (this->m_list).m_a[lVar3];
      if ((pOVar1 != (ON_ClippingPlaneData *)0x0) && (pOVar1->m_sn == sn)) {
        return pOVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return (ON_ClippingPlaneData *)0x0;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::FromSerialNumber(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  // TODO: use binary search
  int count = m_list.Count();
  for (int i=0; i<count; i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data && data->m_sn == sn)
      return data;
  }
  return nullptr;
}